

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.c
# Opt level: O3

void servers_free_cb(config_item *items,uint count)

{
  _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",0x96,
             "servers_free_cb",0,7,"Free memory for %u servers @ %p",(ulong)count,items);
  free(items);
  if (g_svr_cfg != (server_info *)0x0) {
    free(g_svr_cfg);
    g_svr_cfg = (server_info *)0x0;
    g_svr_count = 0;
  }
  return;
}

Assistant:

void servers_free_cb(config_item * items, unsigned int count)
{
    log_error(LOG_DEBUG, "Free memory for %u servers @ %p", count, items);
    free(items);
    if (g_svr_cfg) {
        free(g_svr_cfg);
        g_svr_cfg = NULL;
        g_svr_count = 0;
    }
}